

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemove.cc
# Opt level: O0

void board::makemove::addPiece(int piece,int square,Board *pos)

{
  int iVar1;
  uint64_t *puVar2;
  int *piVar3;
  int color;
  Board *pos_local;
  int square_local;
  int piece_local;
  
  iVar1 = Board::PIECE_COLOR[piece];
  Board::addMaterial(pos,iVar1,Board::PIECE_VAL[piece]);
  Board::setSquare(pos,square,piece);
  Board::hashPiece(pos,piece,square);
  if (Board::PIECE_NO_TEAM[piece] == 1) {
    puVar2 = Board::getPawns(pos);
    bitboard::setBit(puVar2 + iVar1,Board::SQ64[square]);
    puVar2 = Board::getPawns(pos);
    bitboard::setBit(puVar2 + 2,Board::SQ64[square]);
  }
  piVar3 = Board::getPieceList(pos,piece);
  iVar1 = Board::getPieceNum(pos,piece);
  piVar3[iVar1] = square;
  Board::incrementPieceNum(pos,piece);
  return;
}

Assistant:

inline void board::makemove::addPiece(const int piece, const int square, Board& pos)
{
    int color = Board::PIECE_COLOR[piece];
    pos.addMaterial(color, Board::PIECE_VAL[piece]);
    pos.setSquare(square, piece);
    pos.hashPiece(piece, square);
    if (Board::PIECE_NO_TEAM[piece] == WP) {
        bitboard::setBit(pos.getPawns()[color], Board::SQ64[square]);
        bitboard::setBit(pos.getPawns()[BOTH], Board::SQ64[square]);
    }
    pos.getPieceList(piece)[pos.getPieceNum(piece)] = square;
    pos.incrementPieceNum(piece);
}